

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

string * __thiscall
hgdb::json::JSONWriter::escape_abi_cxx11_
          (string *__return_storage_ptr__,JSONWriter *this,string_view value)

{
  const_iterator pvVar1;
  ostream *poVar2;
  value_type c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  stringstream ss;
  string_view value_local;
  
  ss._384_8_ = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&__range2);
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&ss.field_0x180);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&ss.field_0x180);
  for (; __end2 != pvVar1; __end2 = __end2 + 1) {
    if (*__end2 == '\\') {
      poVar2 = std::operator<<((ostream *)&ss.field_0x8,'\\');
      std::operator<<(poVar2,'\\');
    }
    else {
      std::operator<<((ostream *)&ss.field_0x8,*__end2);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

static std::string escape(std::string_view value) {
        std::stringstream ss;
        for (auto c : value) {
            if (c == '\\') {
                ss << '\\' << '\\';
            } else {
                ss << c;
            }
        }

        return ss.str();
    }